

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lagfib2plus.hpp
# Opt level: O3

void __thiscall
trng::lagfib2plus<unsigned_int,_168U,_521U>::discard
          (lagfib2plus<unsigned_int,_168U,_521U> *this,unsigned_long_long n)

{
  int iVar1;
  pointer puVar2;
  pointer puVar3;
  ulong m;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  value_type_conflict4 *__val;
  anon_class_16_2_94731e0a f;
  matrix<unsigned_int,_521UL> local_88;
  matrix<unsigned_int,_521UL> local_68;
  pointer local_48;
  pointer puStack_40;
  pointer local_38;
  
  uVar4 = 0x3f;
  if (n != 0) {
    for (; n >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  m = 0;
  if (1 < n) {
    m = uVar4;
  }
  uVar4 = (uVar4 ^ 0xffffffffffffffc0) + 0x41;
  if (n <= (ulong)(1L << ((byte)m & 0x3f))) {
    uVar4 = m;
  }
  if (uVar4 * 0x86de8d9 < n) {
    puVar2 = (pointer)operator_new(0x109144);
    lVar5 = 0;
    local_68.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = puVar2;
    local_68.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar2 + 0x42451;
    memset(puVar2,0,0x109144);
    puVar3 = puVar2 + 1;
    do {
      *puVar3 = 1;
      lVar5 = lVar5 + 0x824;
      puVar3 = puVar3 + 0x20a;
    } while (lVar5 != 0x108920);
    puVar2[0x42248] = 1;
    puVar2[0x423a9] = 1;
    local_68.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2 + 0x42451;
    power<unsigned_int,521ul>
              (&local_88,(trng *)&local_68,(matrix<unsigned_int,_521UL> *)(n - 0x209),m);
    puVar2 = local_68.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_68.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_68.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_68.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((puVar2 != (pointer)0x0) &&
       (operator_delete(puVar2),
       local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_start != (pointer)0x0)) {
      operator_delete(local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    puVar2 = (pointer)operator_new(0x824);
    lVar5 = 0;
    local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = puVar2;
    local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = puVar2 + 0x209;
    memset(puVar2,0,0x824);
    uVar6 = (this->S).index;
    do {
      puVar2[lVar5 + 0x208] = (this->S).r[uVar6 + (int)lVar5 & 0x3ff];
      lVar5 = lVar5 + -1;
    } while (lVar5 != -0x209);
    f.b = (vector<unsigned_int,_521UL> *)&local_88;
    f.a = &local_68;
    local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar2 + 0x209;
    vector<unsigned_int,521ul>::operator*((vector<unsigned_int,521ul> *)&local_48,f);
    puVar2 = local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = local_48;
    local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puStack_40;
    local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_38;
    local_48 = (pointer)0x0;
    puStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    if ((puVar2 != (pointer)0x0) && (operator_delete(puVar2), local_48 != (pointer)0x0)) {
      operator_delete(local_48);
    }
    uVar6 = (int)(matrix<unsigned_int,_521UL> *)(n - 0x209) + (this->S).index;
    (this->S).index = uVar6 & 0x3ff;
    lVar5 = 0;
    do {
      (this->S).r[uVar6 + (int)lVar5 & 0x3ff] =
           local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[lVar5 + 0x208];
      lVar5 = lVar5 + -1;
    } while (lVar5 != -0x209);
    operator_delete(local_88.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    if (local_68.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68.data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    n = 0x209;
  }
  else if (n == 0) {
    return;
  }
  uVar4 = (ulong)(this->S).index;
  do {
    iVar1 = (int)uVar4;
    uVar6 = iVar1 + 1U & 0x3ff;
    uVar4 = (ulong)uVar6;
    (this->S).r[uVar4] = (this->S).r[iVar1 + 0x1f8U & 0x3ff] + (this->S).r[iVar1 + 0x359U & 0x3ff];
    n = n - 1;
  } while (n != 0);
  (this->S).index = uVar6;
  return;
}

Assistant:

void discard(unsigned long long n) {
      const unsigned int matrix_size = B;
      using matrix_type = matrix<result_type, matrix_size>;
      using vector_type = vector<result_type, matrix_size>;
      using size_type = typename matrix_type::size_type;
      const unsigned long long n_pivot{int_math::log2_ceil(n) * B * B * B};
      constexpr auto mask = int_math::mask(B);
      if (n > n_pivot) {
        const unsigned long long n_partial{n - matrix_size};
        matrix_type M;
        for (size_type i{0}; i < matrix_size - 1; ++i)
          M(i, i + 1) = 1;
        M(matrix_size - 1, matrix_size - B) = 1;
        M(matrix_size - 1, matrix_size - A) = 1;
        M = power(M, n_partial);
        vector_type V;
        for (size_type i{0}; i < matrix_size; ++i)
          V(matrix_size - 1 - i) = S.r[(S.index - i) & mask];
        V = M * V;
        S.index = static_cast<unsigned int>(S.index + n_partial);
        S.index &= mask;
        for (size_type i{0}; i < matrix_size; ++i)
          S.r[(S.index - i) & mask] = V(matrix_size - 1 - i);
        n -= n_partial;
      }
      for (unsigned long long i{0}; i < n; ++i)
        step();
    }